

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCodeEditor_UNIX.cxx
# Opt level: O3

int __thiscall ExternalCodeEditor::open_editor(ExternalCodeEditor *this,char *editor_cmd,char *code)

{
  int iVar1;
  pid_t pVar2;
  char *pcVar3;
  int *piVar4;
  size_t __n;
  size_t sVar5;
  char *pcVar6;
  char *fmt;
  stat sbuf;
  stat64 local_c0;
  
  pcVar3 = this->filename_;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = tmp_filename(this);
    set_filename(this,pcVar3);
    pcVar3 = this->filename_;
    if (pcVar3 == (char *)0x0) {
      return -1;
    }
  }
  iVar1 = stat64(pcVar3,&local_c0);
  if (((-1 < iVar1) && ((local_c0.st_mode & 0xf000) == 0x8000)) && (this->pid_ != -1)) {
    pVar2 = reap_editor(this);
    if (pVar2 == 0) {
      fl_alert("Editor Already Open\n  file=\'%s\'\n  pid=%ld",this->filename_,(long)this->pid_);
      return 0;
    }
    if (pVar2 == -1) {
      piVar4 = __errno_location();
      pcVar3 = strerror(*piVar4);
      fl_alert("ERROR: waitpid() failed: %s\nfile=\'%s\', pid=%ld",pcVar3,this->filename_,
               (long)this->pid_);
      return -1;
    }
    if (G_debug != 0) {
      printf("*** REAPED EXTERNAL EDITOR: PID %ld\n",(long)pVar2);
    }
    pcVar3 = tmp_filename(this);
    set_filename(this,pcVar3);
  }
  pcVar3 = this->filename_;
  iVar1 = open64(pcVar3,0x41,0x1b6);
  if (iVar1 == -1) {
    piVar4 = __errno_location();
    pcVar6 = strerror(*piVar4);
    fmt = "ERROR: open() \'%s\': %s";
LAB_001827b3:
    fl_alert(fmt,pcVar3,pcVar6);
  }
  else {
    __n = strlen(code);
    sVar5 = write(iVar1,code,__n);
    if (sVar5 == 0xffffffffffffffff) {
      piVar4 = __errno_location();
      pcVar6 = strerror(*piVar4);
      fl_alert("ERROR: write() \'%s\': %s",pcVar3,pcVar6);
    }
    else {
      if (sVar5 == __n) {
        close(iVar1);
        iVar1 = stat64(this->filename_,&local_c0);
        if (-1 < iVar1) {
          this->file_mtime_ = local_c0.st_mtim.tv_sec;
          this->file_size_ = local_c0.st_size;
          iVar1 = start_editor(this,editor_cmd,this->filename_);
          if (-1 < iVar1) {
            return 0;
          }
          if (G_debug != 0) {
            puts("Editor failed to start");
            return -1;
          }
          return -1;
        }
        pcVar3 = this->filename_;
        piVar4 = __errno_location();
        pcVar6 = strerror(*piVar4);
        fmt = "ERROR: can\'t stat(\'%s\'): %s";
        goto LAB_001827b3;
      }
      fl_alert("ERROR: write() \'%s\': wrote only %lu bytes, expected %lu",pcVar3,sVar5,__n);
    }
    close(iVar1);
  }
  return -1;
}

Assistant:

int ExternalCodeEditor::open_editor(const char *editor_cmd,
                                    const char *code) {
  // Make sure a temp filename exists
  if ( !filename() ) {
    set_filename(tmp_filename());
    if ( !filename() ) return -1;
  }
  // See if tmpfile already exists or editor already open
  if ( is_file(filename()) ) {
    if ( is_editing() ) {
      // See if editor recently closed but not reaped; try to reap
      pid_t wpid = reap_editor();
      switch (wpid) {
        case -1:        // waitpid() failed
          fl_alert("ERROR: waitpid() failed: %s\nfile='%s', pid=%ld",
            strerror(errno), filename(), (long)pid_);
          return -1;
        case 0:         // process still running
          fl_alert("Editor Already Open\n  file='%s'\n  pid=%ld",
            filename(), (long)pid_);
          return 0;
        default:        // process reaped, wpid is pid reaped
          if ( G_debug )
            printf("*** REAPED EXTERNAL EDITOR: PID %ld\n", (long)wpid);
          break;        // fall thru to open new editor instance
      }
      // Reinstate tmp filename (reap_editor() clears it)
      set_filename(tmp_filename());
    }
  }
  if ( save_file(filename(), code) < 0 ) {
    return -1;  // errors were shown in dialog
  }
  // Update mtime/size from closed file
  struct stat sbuf;
  if ( stat(filename(), &sbuf) < 0 ) {
    fl_alert("ERROR: can't stat('%s'): %s", filename(), strerror(errno));
    return -1;
  }
  file_mtime_ = sbuf.st_mtime;
  file_size_  = sbuf.st_size;
  if ( start_editor(editor_cmd, filename()) < 0 ) { // open file in external editor
    if ( G_debug ) printf("Editor failed to start\n");
    return -1;  // errors were shown in dialog
  }
  return 0;
}